

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# battle_check.cpp
# Opt level: O0

void def_check(int *shielding,bool *defend,int *damage)

{
  ostream *poVar1;
  void *pvVar2;
  int *damage_local;
  bool *defend_local;
  int *shielding_local;
  
  if ((*shielding == 0) && ((*defend & 1U) == 1)) {
    poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_ccf8);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)((double)*damage * 0.6));
    poVar1 = std::operator<<(poVar1,anon_var_dwarf_cd50 + 0x14);
    pvVar2 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
    *damage = (int)((double)*damage * 0.4);
    *defend = false;
  }
  else if ((*shielding < 1) || ((*defend & 1U) != 0)) {
    if ((0 < *shielding) && ((*defend & 1U) == 1)) {
      poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_cd50);
      pvVar2 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
      *defend = false;
      poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_cd24);
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,*damage);
      poVar1 = std::operator<<(poVar1,anon_var_dwarf_cd3a);
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      *damage = 0;
    }
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_cd24);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*damage);
    poVar1 = std::operator<<(poVar1,anon_var_dwarf_cd3a);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    *damage = 0;
  }
  return;
}

Assistant:

void def_check(int* shielding,bool* defend,int* damage){
    if(*shielding==0&&*defend==true)
    {
        cout<<"勇者防禦住了 "<<int(*damage*0.6)<<" 點傷害"<<endl<<endl;
        *damage=*damage*0.4;
        *defend=false;
    }
    else if(*shielding>0&&*defend==false)
    {
        cout<<"(護盾吸收了 "<<*damage<<" 點傷害)"<<endl;
        *damage=0;
    }
    else if(*shielding>0&&*defend==true)
    {
        cout<<"勇者防禦住了 0 點傷害"<<endl<<endl;
        *defend=false;
        cout<<"(護盾吸收了 "<<*damage<<" 點傷害)"<<endl;
        *damage=0;
    }
}